

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

int has_destructor(symbol *sp,lemon *lemp)

{
  char **ppcVar1;
  
  if (sp->type == TERMINAL) {
    ppcVar1 = &lemp->tokendest;
  }
  else {
    if (lemp->vardest != (char *)0x0) {
      return 1;
    }
    ppcVar1 = &sp->destructor;
  }
  return (int)(*ppcVar1 != (char *)0x0);
}

Assistant:

int has_destructor(struct symbol *sp, struct lemon *lemp)
{
  int ret;
  if( sp->type==TERMINAL ){
    ret = lemp->tokendest!=0;
  }else{
    ret = lemp->vardest!=0 || sp->destructor!=0;
  }
  return ret;
}